

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O2

void __thiscall Solution::deleteNursesAndTurns(Solution *this)

{
  pointer pvVar1;
  Turn *this_00;
  void *pvVar2;
  pointer ppTVar3;
  _Base_ptr p_Var4;
  pointer ppTVar5;
  pointer __x;
  vector<Turn_*,_std::allocator<Turn_*>_> day;
  
  pvVar1 = (this->turns).
           super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->turns).
             super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
    std::vector<Turn_*,_std::allocator<Turn_*>_>::vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)
               &day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>,__x);
    ppTVar3 = day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppTVar5 = day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppTVar5 != ppTVar3; ppTVar5 = ppTVar5 + 1) {
      this_00 = *ppTVar5;
      if (this_00 != (Turn *)0x0) {
        Turn::~Turn(this_00);
      }
      operator_delete(this_00,0x50);
    }
    std::_Vector_base<Turn_*,_std::allocator<Turn_*>_>::~_Vector_base
              (&day.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>);
  }
  for (p_Var4 = (this->nurses)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->nurses)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pvVar2 = *(void **)(p_Var4 + 2);
    if (pvVar2 != (void *)0x0) {
      std::_Vector_base<Turn_*,_std::allocator<Turn_*>_>::~_Vector_base
                ((_Vector_base<Turn_*,_std::allocator<Turn_*>_> *)((long)pvVar2 + 8));
    }
    operator_delete(pvVar2,0x20);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  ::clear(&(this->nurses)._M_t);
  std::
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  ::clear(&this->turns);
  return;
}

Assistant:

void Solution::deleteNursesAndTurns() {
    for(vector<Turn*> day : turns)
        for(Turn* turn : day)
            delete turn;
    for(auto const &nurse: nurses)
        delete nurse.second;

    nurses.clear();
    turns.clear();
}